

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenAddTagImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType params,BinaryenType results)

{
  Global *pGVar1;
  pointer pTVar2;
  Name local_d8;
  Name local_c8;
  Type local_b8;
  Type local_b0;
  Signature local_a8;
  Name local_98;
  Name local_88 [2];
  Name local_68;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_58;
  __single_object tag_1;
  Global *tag;
  BinaryenType results_local;
  BinaryenType params_local;
  char *externalBaseName_local;
  char *externalModuleName_local;
  char *internalName_local;
  BinaryenModuleRef module_local;
  
  wasm::Name::Name((Name *)&tag_1,internalName);
  pGVar1 = wasm::Module::getGlobalOrNull(module,(Name)_tag_1);
  if (pGVar1 == (Global *)0x0) {
    std::make_unique<wasm::Tag>();
    wasm::Name::Name(&local_68,internalName);
    pTVar2 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    wasm::Name::operator=((Name *)pTVar2,&local_68);
    wasm::Name::Name(local_88,externalModuleName);
    pTVar2 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    wasm::Name::operator=(&(pTVar2->super_Importable).module,local_88);
    wasm::Name::Name(&local_98,externalBaseName);
    pTVar2 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    wasm::Name::operator=(&(pTVar2->super_Importable).base,&local_98);
    wasm::Type::Type(&local_b0,params);
    wasm::Type::Type(&local_b8,results);
    wasm::Signature::Signature(&local_a8,local_b0,local_b8);
    pTVar2 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    (pTVar2->sig).params.id = local_a8.params.id;
    (pTVar2->sig).results.id = local_a8.results.id;
    wasm::Module::addTag(module,&local_58);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_58);
  }
  else {
    wasm::Name::Name(&local_c8,externalModuleName);
    wasm::Name::operator=(&(pGVar1->super_Importable).module,&local_c8);
    wasm::Name::Name(&local_d8,externalBaseName);
    wasm::Name::operator=(&(pGVar1->super_Importable).base,&local_d8);
  }
  return;
}

Assistant:

void BinaryenAddTagImport(BinaryenModuleRef module,
                          const char* internalName,
                          const char* externalModuleName,
                          const char* externalBaseName,
                          BinaryenType params,
                          BinaryenType results) {
  auto* tag = ((Module*)module)->getGlobalOrNull(internalName);
  if (tag == nullptr) {
    auto tag = std::make_unique<Tag>();
    tag->name = internalName;
    tag->module = externalModuleName;
    tag->base = externalBaseName;
    tag->sig = Signature(Type(params), Type(results));
    ((Module*)module)->addTag(std::move(tag));
  } else {
    // already exists so just set module and base
    tag->module = externalModuleName;
    tag->base = externalBaseName;
  }
}